

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

reference<mpt::layout> * __thiscall
mpt::reference<mpt::layout>::operator=(reference<mpt::layout> *this,reference<mpt::layout> *ref)

{
  int iVar1;
  undefined4 extraout_var;
  layout *plVar2;
  
  plVar2 = ref->_ref;
  if (plVar2 != this->_ref) {
    if (plVar2 == (layout *)0x0) {
      plVar2 = (layout *)0x0;
    }
    else {
      iVar1 = (*(plVar2->super_item_group).super_metatype.super_convertable._vptr_convertable[2])
                        (plVar2);
      if (CONCAT44(extraout_var,iVar1) == 0) {
        plVar2 = (layout *)0x0;
      }
    }
    if (this->_ref != (layout *)0x0) {
      (*(this->_ref->super_item_group).super_metatype.super_convertable._vptr_convertable[1])();
    }
    this->_ref = plVar2;
  }
  return this;
}

Assistant:

inline reference & operator= (reference const &ref)
	{
		T *r = ref._ref;
		if (r == _ref) {
			return *this;
		}
		if (r && !r->addref()) {
			r = 0;
		}
		if (_ref) _ref->unref();
		_ref = r;
		return *this;
	}